

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::UseKeyAndValueFromEntry
          (Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  MapEntryImpl<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>
  *pMVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  string *psVar4;
  undefined8 *puVar5;
  pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  local_30;
  
  iVar3 = (*(this->entry_->super_MessageLite)._vptr_MessageLite[0xd])();
  this->key_ = *(long *)CONCAT44(extraout_var,iVar3);
  Map<long,std::__cxx11::string>::InnerMap::insert<long_const&>(&local_30,this->map_,&this->key_);
  this->value_ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &(local_30.first.node_)->field_0x8;
  pMVar1 = this->entry_;
  pMVar1->_has_bits_[0] = pMVar1->_has_bits_[0] | 2;
  uVar2 = (pMVar1->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  psVar4 = ArenaStringPtr::Mutable_abi_cxx11_(&pMVar1->value_,puVar5);
  std::__cxx11::string::operator=((string *)this->value_ptr_,(string *)psVar4);
  return;
}

Assistant:

void UseKeyAndValueFromEntry() {
      // Update key_ in case we need it later (because key() is called).
      // This is potentially inefficient, especially if the key is
      // expensive to copy (e.g., a long string), but this is a cold
      // path, so it's not a big deal.
      key_ = entry_->key();
      value_ptr_ = &(*map_)[key_];
      ValueMover::Move(entry_->mutable_value(), value_ptr_);
    }